

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkLayer.cpp
# Opt level: O0

void __thiscall
nanoNet::NeuralNetworkLayer::NeuralNetworkLayer
          (NeuralNetworkLayer *this,size_t inputCount,size_t outputCount,
          ActivationFunction *activationFunction)

{
  allocator<float> *this_00;
  allocator<std::vector<float,_std::allocator<float>_>_> *this_01;
  size_type sVar1;
  size_type __n;
  bool bVar2;
  result_type __sd;
  reference this_02;
  reference pfVar3;
  result_type_conflict1 rVar4;
  float *value_1;
  iterator __end2;
  iterator __begin2;
  vector<float,_std::allocator<float>_> *__range2;
  vector<float,_std::allocator<float>_> *values;
  iterator __end1_1;
  iterator __begin1_1;
  matrix_type *__range1_1;
  float *value;
  iterator __end1;
  iterator __begin1;
  vector_type *__range1;
  uniform_real_distribution<float> uniform;
  mt19937 rng;
  vector<float,_std::allocator<float>_> local_58;
  allocator<float> local_29;
  ActivationFunction *local_28;
  ActivationFunction *activationFunction_local;
  size_t outputCount_local;
  size_t inputCount_local;
  NeuralNetworkLayer *this_local;
  
  this->m_inputCount = inputCount;
  this->m_outputCount = outputCount;
  (this->m_activationFunction).m_option = activationFunction->m_option;
  sVar1 = this->m_outputCount;
  local_28 = activationFunction;
  activationFunction_local = (ActivationFunction *)outputCount;
  outputCount_local = inputCount;
  inputCount_local = (size_t)this;
  std::allocator<float>::allocator(&local_29);
  std::vector<float,_std::allocator<float>_>::vector(&this->m_biases,sVar1,&local_29);
  std::allocator<float>::~allocator(&local_29);
  sVar1 = this->m_inputCount;
  __n = this->m_outputCount;
  this_00 = (allocator<float> *)((long)&rng._M_p + 7);
  std::allocator<float>::allocator(this_00);
  std::vector<float,_std::allocator<float>_>::vector(&local_58,sVar1,this_00);
  this_01 = (allocator<std::vector<float,_std::allocator<float>_>_> *)((long)&rng._M_p + 6);
  std::allocator<std::vector<float,_std::allocator<float>_>_>::allocator(this_01);
  std::
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  ::vector(&this->m_weights,__n,&local_58,this_01);
  std::allocator<std::vector<float,_std::allocator<float>_>_>::~allocator
            ((allocator<std::vector<float,_std::allocator<float>_>_> *)((long)&rng._M_p + 6));
  std::vector<float,_std::allocator<float>_>::~vector(&local_58);
  std::allocator<float>::~allocator((allocator<float> *)((long)&rng._M_p + 7));
  __sd = time((time_t *)0x0);
  std::
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  ::mersenne_twister_engine
            ((mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
              *)&uniform,__sd);
  std::uniform_real_distribution<float>::uniform_real_distribution
            ((uniform_real_distribution<float> *)&__range1,-1.0,1.0);
  __end1 = std::vector<float,_std::allocator<float>_>::begin(&this->m_biases);
  value = (float *)std::vector<float,_std::allocator<float>_>::end(&this->m_biases);
  while( true ) {
    bVar2 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_>
                                *)&value);
    if (!bVar2) break;
    pfVar3 = __gnu_cxx::__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_>::
             operator*(&__end1);
    rVar4 = std::uniform_real_distribution<float>::operator()
                      ((uniform_real_distribution<float> *)&__range1,
                       (mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                        *)&uniform);
    *pfVar3 = rVar4;
    __gnu_cxx::__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_>::operator++
              (&__end1);
  }
  __end1_1 = std::
             vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
             ::begin(&this->m_weights);
  values = (vector<float,_std::allocator<float>_> *)
           std::
           vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
           ::end(&this->m_weights);
  while( true ) {
    bVar2 = __gnu_cxx::operator!=
                      (&__end1_1,
                       (__normal_iterator<std::vector<float,_std::allocator<float>_>_*,_std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>
                        *)&values);
    if (!bVar2) break;
    this_02 = __gnu_cxx::
              __normal_iterator<std::vector<float,_std::allocator<float>_>_*,_std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>
              ::operator*(&__end1_1);
    __end2 = std::vector<float,_std::allocator<float>_>::begin(this_02);
    value_1 = (float *)std::vector<float,_std::allocator<float>_>::end(this_02);
    while( true ) {
      bVar2 = __gnu_cxx::operator!=
                        (&__end2,(__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_>
                                  *)&value_1);
      if (!bVar2) break;
      pfVar3 = __gnu_cxx::__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_>::
               operator*(&__end2);
      rVar4 = std::uniform_real_distribution<float>::operator()
                        ((uniform_real_distribution<float> *)&__range1,
                         (mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                          *)&uniform);
      *pfVar3 = rVar4;
      __gnu_cxx::__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_>::operator++
                (&__end2);
    }
    __gnu_cxx::
    __normal_iterator<std::vector<float,_std::allocator<float>_>_*,_std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>
    ::operator++(&__end1_1);
  }
  return;
}

Assistant:

NeuralNetworkLayer::NeuralNetworkLayer(std::size_t inputCount, std::size_t outputCount,
    const ActivationFunction& activationFunction)
    : m_inputCount(inputCount)
    , m_outputCount(outputCount)
    , m_activationFunction(activationFunction)
    , m_biases(m_outputCount)
    , m_weights(m_outputCount, vector_type(m_inputCount))
{
    std::mt19937 rng(std::time(NULL));
    std::uniform_real_distribution<float> uniform(-1.0f, 1.0f);

    for (auto& value : m_biases)
        value = uniform(rng);

    for (auto& values : m_weights)
        for (auto& value : values)
            value = uniform(rng);
}